

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::Transaction::CheckTxOutIndex(Transaction *this,uint32_t index,int line,char *caller)

{
  size_type sVar1;
  char *pcVar2;
  CfdException *this_00;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  CfdSourceLocation location;
  char *caller_local;
  int line_local;
  uint32_t index_local;
  Transaction *this_local;
  
  location.funcname = caller;
  caller_local._0_4_ = line;
  caller_local._4_4_ = index;
  _line_local = this;
  sVar1 = ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::size(&this->vout_);
  if (sVar1 <= caller_local._4_4_) {
    pcVar2 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                     ,0x2f);
    local_38 = (undefined1  [8])(pcVar2 + 1);
    location.filename._0_4_ = (int)caller_local;
    location._8_8_ = location.funcname;
    logger::warn<unsigned_int&>
              ((CfdSourceLocation *)local_38,"vout[{}] out_of_range.",
               (uint *)((long)&caller_local + 4));
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"vin out_of_range error.",&local_59);
    CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_58);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void Transaction::CheckTxOutIndex(
    uint32_t index, int line, const char *caller) const {
  if (vout_.size() <= index) {
    cfd::core::logger::CfdSourceLocation location = {
        CFD_LOG_FILE, line, caller};
    warn(location, "vout[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
}